

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O0

Plug * server_conn_plug(server_config *cfg,server_instance **inst_out)

{
  uint uVar1;
  server_instance *__s;
  Plug *pPVar2;
  server_instance *inst;
  server_instance **inst_out_local;
  server_config *cfg_local;
  
  __s = (server_instance *)safemalloc(1,0x28,0);
  memset(__s,0,0x28);
  uVar1 = next_id + 1;
  __s->id = next_id;
  next_id = uVar1;
  (__s->ap).shared = cfg->ap_shared;
  if ((cfg->ssc->stunt_allow_trivial_ki_auth & 1U) != 0) {
    (__s->ap).kbdint_state = 1;
  }
  (__s->logpolicy).vt = &server_logpolicy_vt;
  __s->cfg = cfg;
  if (inst_out != (server_instance **)0x0) {
    *inst_out = __s;
  }
  pPVar2 = ssh_server_plug(cfg->conf,cfg->ssc,cfg->hostkeys,cfg->nhostkeys,cfg->hostkey1,&__s->ap,
                           &__s->logpolicy,&unix_live_sftpserver_vt);
  return pPVar2;
}

Assistant:

static Plug *server_conn_plug(
    struct server_config *cfg, struct server_instance **inst_out)
{
    struct server_instance *inst = snew(struct server_instance);

    memset(inst, 0, sizeof(*inst));

    inst->id = next_id++;
    inst->ap.shared = cfg->ap_shared;
    if (cfg->ssc->stunt_allow_trivial_ki_auth)
        inst->ap.kbdint_state = 1;
    inst->logpolicy.vt = &server_logpolicy_vt;
    inst->cfg = cfg;

    if (inst_out)
        *inst_out = inst;

    return ssh_server_plug(
        cfg->conf, cfg->ssc, cfg->hostkeys, cfg->nhostkeys, cfg->hostkey1,
        &inst->ap, &inst->logpolicy, &unix_live_sftpserver_vt);
}